

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O2

void __thiscall
FIX44::MarketDataRequest::MarketDataRequest
          (MarketDataRequest *this,MDReqID *aMDReqID,
          SubscriptionRequestType *aSubscriptionRequestType,MarketDepth *aMarketDepth)

{
  FieldBase FStack_88;
  
  MsgType();
  Message::Message(&this->super_Message,(MsgType *)&FStack_88);
  FIX::FieldBase::~FieldBase(&FStack_88);
  *(undefined ***)&this->super_Message = &PTR__Message_0017f3c0;
  set(this,aMDReqID);
  set(this,aSubscriptionRequestType);
  set(this,aMarketDepth);
  return;
}

Assistant:

MarketDataRequest(
      const FIX::MDReqID& aMDReqID,
      const FIX::SubscriptionRequestType& aSubscriptionRequestType,
      const FIX::MarketDepth& aMarketDepth )
    : Message(MsgType())
    {
      set(aMDReqID);
      set(aSubscriptionRequestType);
      set(aMarketDepth);
    }